

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDataStack.h
# Opt level: O2

void __thiscall
HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
          (HighsDataStack *this,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *r)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer __src;
  size_t __n;
  
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(r->
              super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(r->
              super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              )._M_impl.super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->data,(size_type)(pcVar1 + (__n - (long)pcVar2) + 8));
  __src = (r->
          super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__src != (r->
               super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    memcpy(pcVar1 + ((long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)pcVar2),__src,__n);
  }
  *(long *)(pcVar1 + (long)((this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + (__n - (long)pcVar2))) =
       (long)__n >> 4;
  return;
}

Assistant:

void push(const std::vector<T>& r) {
    std::size_t offset = data.size();
    std::size_t numData = r.size();
    // store the data
    data.resize(offset + numData * sizeof(T) + sizeof(std::size_t));
    if (!r.empty())
      std::memcpy(data.data() + offset, r.data(), numData * sizeof(T));
    // store the vector size
    offset += numData * sizeof(T);
    std::memcpy(data.data() + offset, &numData, sizeof(std::size_t));
  }